

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void check_exit_request_ppc64(TCGContext_conflict10 *tcg_ctx)

{
  TCGv_i32 ret;
  TCGv_i32 count;
  TCGContext_conflict10 *tcg_ctx_local;
  
  if ((tcg_ctx->uc->no_exit_request & 1U) == 0) {
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,-0x10);
    tcg_gen_brcondi_i32_ppc64(tcg_ctx,TCG_COND_LT,ret,0,tcg_ctx->exitreq_label);
    tcg_temp_free_i32(tcg_ctx,ret);
  }
  return;
}

Assistant:

void check_exit_request(TCGContext *tcg_ctx)
{
    TCGv_i32 count;

    // Unicorn:
    //   For ARM IT block, we couldn't exit in the middle of the
    //   block and this is the our hack here.
    if (tcg_ctx->uc->no_exit_request) {
        return;
    }

    count = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_ld_i32(tcg_ctx, count, tcg_ctx->cpu_env,
                   offsetof(ArchCPU, neg.icount_decr.u32) -
                   offsetof(ArchCPU, env));

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_LT, count, 0, tcg_ctx->exitreq_label);

    tcg_temp_free_i32(tcg_ctx, count);
}